

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtIDebugDraw.h
# Opt level: O3

void __thiscall
cbtIDebugDraw::drawCylinder
          (cbtIDebugDraw *this,cbtScalar radius,cbtScalar halfHeight,int upAxis,
          cbtTransform *transform,cbtVector3 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint uVar15;
  cbtVector3 *pcVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM16 [64];
  undefined1 local_c8 [8];
  uint uStack_c0;
  undefined1 local_b8 [8];
  uint uStack_b0;
  undefined1 local_a8 [8];
  uint uStack_a0;
  undefined1 local_98 [8];
  uint uStack_90;
  cbtVector3 *local_80;
  undefined1 local_78 [8];
  uint uStack_70;
  undefined1 local_60 [16];
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  auVar30._4_60_ = in_register_00001244;
  auVar30._0_4_ = halfHeight;
  fVar1 = (transform->m_origin).m_floats[0];
  lVar22 = (long)upAxis;
  auVar24._8_4_ = 0x80000000;
  auVar24._0_8_ = 0x8000000080000000;
  auVar24._12_4_ = 0x80000000;
  auVar24 = vxorps_avx512vl(auVar30._0_16_,auVar24);
  uVar23 = 0xffffffe2;
  fVar2 = (transform->m_origin).m_floats[1];
  lVar21 = (long)(upAxis + 1 + ((upAxis + 1) / 3) * -3);
  fVar3 = (transform->m_origin).m_floats[2];
  lVar20 = (long)(upAxis + 2 + ((upAxis + 2) / 3) * -3);
  _local_a8 = ZEXT812(0);
  register0x0000120c = 0;
  _local_78 = _local_a8;
  *(cbtScalar *)(local_78 + lVar22 * 4) = halfHeight;
  _local_98 = _local_a8;
  local_80 = color;
  *(int *)(local_98 + lVar22 * 4) = auVar24._0_4_;
  *(cbtScalar *)(local_a8 + lVar22 * 4) = halfHeight;
  do {
    uVar23 = uVar23 + 0x1e;
    auVar24 = vcvtsi2ss_avx512f(in_ZMM16._0_16_,uVar23);
    fVar28 = auVar24._0_4_ * 0.017453292;
    fVar27 = sinf(fVar28);
    *(float *)(local_98 + lVar21 * 4) = fVar27 * radius;
    *(float *)(local_a8 + lVar21 * 4) = fVar27 * radius;
    fVar28 = cosf(fVar28);
    pcVar16 = local_80;
    *(float *)(local_98 + lVar20 * 4) = fVar28 * radius;
    *(float *)(local_a8 + lVar20 * 4) = fVar28 * radius;
    fVar28 = (transform->m_basis).m_el[1].m_floats[1];
    fVar27 = (transform->m_basis).m_el[0].m_floats[1];
    fVar4 = (transform->m_basis).m_el[2].m_floats[1];
    auVar32 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[0]);
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (float)local_98._4_4_)),auVar32,
                              ZEXT416((uint)local_98._0_4_));
    auVar29 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[0]);
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (float)local_98._4_4_)),auVar29,
                              ZEXT416((uint)local_98._0_4_));
    auVar34 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[0]);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_98._4_4_)),auVar34,
                              ZEXT416((uint)local_98._0_4_));
    auVar33 = ZEXT416((uint)(transform->m_basis).m_el[1].m_floats[2]);
    auVar24 = vfmadd231ss_fma(auVar24,auVar33,ZEXT416(uStack_90));
    auVar31 = ZEXT416((uint)(transform->m_basis).m_el[0].m_floats[2]);
    auVar26 = vfmadd231ss_fma(auVar26,auVar31,ZEXT416(uStack_90));
    auVar35 = ZEXT416((uint)(transform->m_basis).m_el[2].m_floats[2]);
    auVar25 = vfmadd231ss_fma(auVar25,auVar35,ZEXT416(uStack_90));
    auVar24 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar26._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar24._0_4_)),0x10);
    _local_b8 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
    auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (float)local_a8._4_4_)),
                              ZEXT416((uint)local_a8._0_4_),auVar29);
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (float)local_a8._4_4_)),
                              ZEXT416((uint)local_a8._0_4_),auVar32);
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_a8._4_4_)),auVar34,
                              ZEXT416((uint)local_a8._0_4_));
    auVar24 = vfmadd231ss_fma(auVar24,ZEXT416(uStack_a0),auVar31);
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416(uStack_a0),auVar33);
    auVar25 = vfmadd231ss_fma(auVar25,auVar35,ZEXT416(uStack_a0));
    auVar24 = vinsertps_avx(ZEXT416((uint)(fVar1 + auVar24._0_4_)),
                            ZEXT416((uint)(fVar2 + auVar26._0_4_)),0x10);
    _local_c8 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar3 + auVar25._0_4_)),0x28);
    (*this->_vptr_cbtIDebugDraw[4])(this,local_b8,local_c8,pcVar16);
    pcVar16 = local_80;
  } while (uVar23 < 0x14a);
  uVar18 = local_78._4_4_;
  uVar17 = local_78._0_4_;
  uVar19 = uStack_70;
  _local_b8 = ZEXT816(0);
  _local_c8 = ZEXT816(0);
  *(undefined4 *)(local_c8 + lVar21 * 4) = 0x3f800000;
  *(undefined4 *)(local_b8 + lVar22 * 4) = 0x3f800000;
  fVar28 = (transform->m_basis).m_el[0].m_floats[1];
  cVar5 = (transform->m_basis).m_el[0].m_floats[0];
  cVar6 = (transform->m_basis).m_el[0].m_floats[2];
  fVar27 = (transform->m_basis).m_el[1].m_floats[1];
  cVar7 = (transform->m_basis).m_el[1].m_floats[0];
  cVar8 = (transform->m_basis).m_el[1].m_floats[2];
  fVar4 = (transform->m_basis).m_el[2].m_floats[1];
  cVar9 = (transform->m_basis).m_el[2].m_floats[0];
  auVar25 = ZEXT416((uint)uVar17);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar18 * fVar28)),ZEXT416((uint)cVar5),auVar25);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar18 * fVar27)),ZEXT416((uint)cVar7),auVar25);
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar18 * fVar4)),ZEXT416((uint)cVar9),auVar25);
  cVar10 = (transform->m_basis).m_el[2].m_floats[2];
  auVar29 = ZEXT416(uVar19);
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar6),auVar29);
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar8),auVar29);
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)cVar10),auVar29);
  uVar13 = local_b8._0_4_;
  uVar15 = uStack_b0;
  auVar24 = vinsertps_avx(ZEXT416((uint)(fVar1 - auVar24._0_4_)),
                          ZEXT416((uint)(fVar2 - auVar26._0_4_)),0x10);
  uVar14 = local_b8._4_4_;
  local_40 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar3 - auVar25._0_4_)),0x28);
  auVar29 = ZEXT416((uint)local_b8._0_4_);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)local_b8._4_4_ * fVar28)),ZEXT416((uint)cVar5),
                            auVar29);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)local_b8._4_4_ * fVar27)),ZEXT416((uint)cVar7),
                            auVar29);
  auVar25 = ZEXT416(uStack_b0);
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar6),auVar25);
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar8),auVar25);
  auVar24 = vinsertps_avx(auVar24,auVar26,0x10);
  uVar11 = local_c8._0_4_;
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_b8._4_4_)),ZEXT416((uint)cVar9),
                            auVar29);
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar10),auVar25);
  local_50 = vinsertps_avx(auVar24,auVar26,0x28);
  uVar23 = uStack_c0;
  uVar12 = local_c8._4_4_;
  auVar29 = ZEXT416((uint)local_c8._0_4_);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * (float)local_c8._4_4_)),auVar29,
                            ZEXT416((uint)cVar5));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar27 * (float)local_c8._4_4_)),auVar29,
                            ZEXT416((uint)cVar7));
  auVar25 = ZEXT416(uStack_c0);
  auVar24 = vfmadd231ss_fma(auVar24,auVar25,ZEXT416((uint)cVar6));
  auVar26 = vfmadd231ss_fma(auVar26,auVar25,ZEXT416((uint)cVar8));
  auVar24 = vinsertps_avx(auVar24,auVar26,0x10);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * (float)local_c8._4_4_)),auVar29,
                            ZEXT416((uint)cVar9));
  auVar26 = vfmadd231ss_fma(auVar26,auVar25,ZEXT416((uint)cVar10));
  local_60 = vinsertps_avx(auVar24,auVar26,0x28);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,local_40,local_50,local_60,pcVar16,0);
  fVar28 = (transform->m_basis).m_el[0].m_floats[1];
  fVar27 = (transform->m_basis).m_el[1].m_floats[1];
  cVar5 = (transform->m_basis).m_el[0].m_floats[0];
  cVar6 = (transform->m_basis).m_el[1].m_floats[0];
  cVar7 = (transform->m_basis).m_el[0].m_floats[2];
  cVar8 = (transform->m_basis).m_el[1].m_floats[2];
  fVar4 = (transform->m_basis).m_el[2].m_floats[1];
  cVar9 = (transform->m_basis).m_el[2].m_floats[2];
  cVar10 = (transform->m_basis).m_el[2].m_floats[0];
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar18 * fVar28)),ZEXT416((uint)cVar5),
                            ZEXT416((uint)uVar17));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar18 * fVar27)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)uVar17));
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)cVar7),ZEXT416(uVar19));
  auVar25 = vfmadd231ss_avx512f(auVar26,ZEXT416((uint)cVar8),ZEXT416(uVar19));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar18 * fVar4)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)uVar17));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar9),ZEXT416(uVar19));
  auVar24 = vinsertps_avx(ZEXT416((uint)(auVar24._0_4_ + fVar1)),
                          ZEXT416((uint)(auVar25._0_4_ + fVar2)),0x10);
  local_40 = vinsertps_avx(auVar24,ZEXT416((uint)(auVar26._0_4_ + fVar3)),0x28);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar14 * fVar27)),ZEXT416((uint)cVar6),
                            ZEXT416((uint)uVar13));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar14 * fVar28)),ZEXT416((uint)cVar5),
                            ZEXT416((uint)uVar13));
  auVar25 = vfmadd231ss_avx512f(auVar24,ZEXT416((uint)cVar8),ZEXT416(uVar15));
  auVar24 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar7),ZEXT416(uVar15));
  auVar24 = vinsertps_avx(auVar24,auVar25,0x10);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar14 * fVar4)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)uVar13));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar9),ZEXT416(uVar15));
  local_50 = vinsertps_avx(auVar24,auVar26,0x28);
  auVar24 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar12 * fVar28)),ZEXT416((uint)uVar11),
                            ZEXT416((uint)cVar5));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar12 * fVar27)),ZEXT416((uint)uVar11),
                            ZEXT416((uint)cVar6));
  auVar24 = vfmadd231ss_fma(auVar24,ZEXT416(uVar23),ZEXT416((uint)cVar7));
  auVar26 = vfmadd231ss_avx512f(auVar26,ZEXT416(uVar23),ZEXT416((uint)cVar8));
  auVar24 = vinsertps_avx(auVar24,auVar26,0x10);
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)((float)uVar12 * fVar4)),ZEXT416((uint)cVar10),
                            ZEXT416((uint)uVar11));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)cVar9),ZEXT416(uVar23));
  local_60 = vinsertps_avx(auVar24,auVar26,0x28);
  (*this->_vptr_cbtIDebugDraw[0x11])
            ((ulong)(uint)radius,(ulong)(uint)radius,0,SUB648(ZEXT464(0x40c90fdb),0),
             SUB648(ZEXT464(0x41200000),0),this,local_40,local_50,local_60,pcVar16,0);
  return;
}

Assistant:

virtual void drawCylinder(cbtScalar radius, cbtScalar halfHeight, int upAxis, const cbtTransform& transform, const cbtVector3& color)
	{
		cbtVector3 start = transform.getOrigin();
		cbtVector3 offsetHeight(0, 0, 0);
		offsetHeight[upAxis] = halfHeight;
		int stepDegrees = 30;
		cbtVector3 capStart(0.f, 0.f, 0.f);
		capStart[upAxis] = -halfHeight;
		cbtVector3 capEnd(0.f, 0.f, 0.f);
		capEnd[upAxis] = halfHeight;

		for (int i = 0; i < 360; i += stepDegrees)
		{
			capEnd[(upAxis + 1) % 3] = capStart[(upAxis + 1) % 3] = cbtSin(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			capEnd[(upAxis + 2) % 3] = capStart[(upAxis + 2) % 3] = cbtCos(cbtScalar(i) * SIMD_RADS_PER_DEG) * radius;
			drawLine(start + transform.getBasis() * capStart, start + transform.getBasis() * capEnd, color);
		}
		// Drawing top and bottom caps of the cylinder
		cbtVector3 yaxis(0, 0, 0);
		yaxis[upAxis] = cbtScalar(1.0);
		cbtVector3 xaxis(0, 0, 0);
		xaxis[(upAxis + 1) % 3] = cbtScalar(1.0);
		drawArc(start - transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, cbtScalar(10.0));
		drawArc(start + transform.getBasis() * (offsetHeight), transform.getBasis() * yaxis, transform.getBasis() * xaxis, radius, radius, 0, SIMD_2_PI, color, false, cbtScalar(10.0));
	}